

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

cmValue __thiscall
cmGeneratorTarget::GetFileSuffixInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *language)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  cmMakefile *this_00;
  bool bVar3;
  TargetType TVar4;
  cmValue cVar5;
  char *__s;
  size_t sVar6;
  ArtifactType artifact_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string langSuffix;
  string local_78;
  size_type local_58;
  pointer local_50;
  string local_48;
  
  TVar4 = cmTarget::GetType(this->Target);
  if (((((TVar4 != STATIC_LIBRARY) &&
        (TVar4 = cmTarget::GetType(this->Target), TVar4 != SHARED_LIBRARY)) &&
       (TVar4 = cmTarget::GetType(this->Target), TVar4 != MODULE_LIBRARY)) &&
      (TVar4 = cmTarget::GetType(this->Target), TVar4 != EXECUTABLE)) ||
     ((artifact == ImportLibraryArtifact && (bVar3 = NeedImportLibraryName(this,config), !bVar3))))
  {
    return (cmValue)(string *)0x0;
  }
  TVar4 = cmTarget::GetType(this->Target);
  artifact_00 = artifact;
  if ((TVar4 != SHARED_LIBRARY) &&
     (TVar4 = cmTarget::GetType(this->Target), TVar4 != MODULE_LIBRARY)) {
    TVar4 = cmTarget::GetType(this->Target);
    artifact_00 = RuntimeBinaryArtifact;
    if (TVar4 == EXECUTABLE) {
      artifact_00 = artifact;
    }
  }
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  if (artifact == ImportLibraryArtifact) {
    local_78.field_2._M_allocated_capacity._0_4_ = 0x4f504d49;
    local_78.field_2._M_local_buf[4] = 'R';
    local_78.field_2._M_local_buf[5] = 'T';
    local_78.field_2._M_local_buf[6] = '_';
    local_78.field_2._M_local_buf[7] = 'S';
    local_78.field_2._8_5_ = 0x5849464655;
    local_78._M_string_length = 0xd;
    local_78.field_2._M_local_buf[0xd] = '\0';
    cVar5 = GetProperty(this,&local_78);
  }
  else {
    local_78.field_2._M_allocated_capacity._0_4_ = 0x46465553;
    local_78.field_2._M_local_buf[4] = 'I';
    local_78.field_2._M_local_buf[5] = 'X';
    local_78._M_string_length = 6;
    local_78.field_2._M_local_buf[6] = '\0';
    cVar5 = GetProperty(this,&local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT15(local_78.field_2._M_local_buf[5],
                                               CONCAT14(local_78.field_2._M_local_buf[4],
                                                        local_78.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if (cVar5.Value != (string *)0x0) {
    return (cmValue)cVar5.Value;
  }
  __s = cmTarget::GetSuffixVariableInternal(this->Target,artifact_00);
  sVar2 = language->_M_string_length;
  if (sVar2 != 0) {
    if (__s == (char *)0x0) {
      return (cmValue)(string *)0x0;
    }
    if (*__s != '\0') {
      local_78._M_dataplus._M_p = (pointer)strlen(__s);
      local_78.field_2._M_allocated_capacity._0_4_ = 1;
      local_78.field_2._M_local_buf[4] = '\0';
      local_78.field_2._M_local_buf[5] = '\0';
      local_78.field_2._M_local_buf[6] = '\0';
      local_78.field_2._M_local_buf[7] = '\0';
      local_78.field_2._8_5_ = 0x7bf097;
      local_78.field_2._M_local_buf[0xd] = '\0';
      local_78.field_2._14_2_ = 0;
      local_50 = (language->_M_dataplus)._M_p;
      views._M_len = 3;
      views._M_array = (iterator)&local_78;
      local_78._M_string_length = (size_type)__s;
      local_58 = sVar2;
      cmCatViews_abi_cxx11_(&local_48,views);
      cVar5 = cmMakefile::GetDefinition(this->Makefile,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00498c7e;
    }
  }
  cVar5.Value = (string *)0x0;
LAB_00498c7e:
  if (__s != (char *)0x0 && cVar5.Value == (string *)0x0) {
    this_00 = this->Makefile;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    sVar6 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,__s,__s + sVar6);
    cVar5 = cmMakefile::GetDefinition(this_00,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT17(local_78.field_2._M_local_buf[7],
                               CONCAT16(local_78.field_2._M_local_buf[6],
                                        CONCAT15(local_78.field_2._M_local_buf[5],
                                                 CONCAT14(local_78.field_2._M_local_buf[4],
                                                          local_78.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
  }
  return (cmValue)cVar5.Value;
}

Assistant:

cmValue cmGeneratorTarget::GetFileSuffixInternal(
  std::string const& config, cmStateEnums::ArtifactType artifact,
  const std::string& language) const
{
  // no suffix for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    return nullptr;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty suffix for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact && !this->NeedImportLibraryName(config)) {
    return nullptr;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute suffix value.
  cmValue targetSuffix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_SUFFIX")
                               : this->GetProperty("SUFFIX"));

  if (!targetSuffix) {
    const char* suffixVar = this->Target->GetSuffixVariableInternal(artifact);
    if (!language.empty() && cmNonempty(suffixVar)) {
      std::string langSuffix = cmStrCat(suffixVar, "_", language);
      targetSuffix = this->Makefile->GetDefinition(langSuffix);
    }

    // if there is no suffix on the target nor specific language
    // use the cmake definition.
    if (!targetSuffix && suffixVar) {
      targetSuffix = this->Makefile->GetDefinition(suffixVar);
    }
  }

  return targetSuffix;
}